

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_contains_all_different_sizes(void)

{
  _Bool _Var1;
  bitset_t *b1;
  bitset_t *bitset;
  bitset_t *subset;
  bitset_t *superset;
  size_t subset_size;
  size_t superset_size;
  size_t in_stack_ffffffffffffffd8;
  
  b1 = bitset_create_with_capacity(in_stack_ffffffffffffffd8);
  bitset = bitset_create_with_capacity(in_stack_ffffffffffffffd8);
  bitset_set(bitset,in_stack_ffffffffffffffd8);
  bitset_set(bitset,in_stack_ffffffffffffffd8);
  bitset_set(bitset,in_stack_ffffffffffffffd8);
  bitset_set(bitset,in_stack_ffffffffffffffd8);
  bitset_set(bitset,in_stack_ffffffffffffffd8);
  _Var1 = bitset_contains_all(b1,bitset);
  if (!_Var1) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_contains_all_different_sizes",0xe3);
    exit(1);
  }
  _Var1 = bitset_contains_all(b1,bitset);
  if (!_Var1) {
    bitset_free((bitset_t *)0x102223);
    bitset_free((bitset_t *)0x10222d);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_contains_all_different_sizes",0xe4);
  exit(1);
}

Assistant:

void test_contains_all_different_sizes() {
  const size_t superset_size = 10;
  const size_t subset_size = 5;

  bitset_t *superset = bitset_create_with_capacity(superset_size);
  bitset_t *subset = bitset_create_with_capacity(subset_size);

  bitset_set(superset, 1);
  bitset_set(superset, subset_size - 1);
  bitset_set(superset, subset_size + 1);

  bitset_set(subset, 1);
  bitset_set(subset, subset_size - 1);

  TEST_ASSERT(bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_free(superset);
  bitset_free(subset);
}